

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O2

void __thiscall
SmallArray<SynBinaryOpElement,_32U>::grow(SmallArray<SynBinaryOpElement,_32U> *this,uint newSize)

{
  undefined8 *puVar1;
  undefined4 *puVar2;
  undefined8 *puVar3;
  SynBinaryOpElement *pSVar4;
  uint count;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined8 uVar9;
  SynBinaryOpElement *pSVar10;
  long lVar11;
  uint i;
  uint uVar12;
  ulong uVar13;
  
  uVar12 = (this->max >> 1) + this->max;
  count = newSize + 4;
  if (newSize < uVar12) {
    count = uVar12;
  }
  if (this->allocator == (Allocator *)0x0) {
    pSVar10 = (SynBinaryOpElement *)(*(code *)NULLC::alloc)(count << 5 | 4);
    if (count != 0) {
      lVar11 = 0;
      do {
        *(undefined8 *)((long)&pSVar10->value + lVar11) = 0;
        *(undefined4 *)((long)&pSVar10->type + lVar11) = 0;
        puVar1 = (undefined8 *)((long)&pSVar10->begin + lVar11);
        *puVar1 = 0;
        puVar1[1] = 0;
        lVar11 = lVar11 + 0x20;
      } while ((long)(int)count * 0x20 != lVar11);
    }
  }
  else {
    pSVar10 = Allocator::construct<SynBinaryOpElement>(this->allocator,count);
  }
  lVar11 = 0;
  uVar13 = 0;
  while( true ) {
    pSVar4 = this->data;
    if (this->count <= uVar13) break;
    puVar2 = (undefined4 *)((long)&pSVar4->begin + lVar11);
    uVar5 = *puVar2;
    uVar6 = puVar2[1];
    uVar7 = puVar2[2];
    uVar8 = puVar2[3];
    puVar1 = (undefined8 *)((long)&pSVar4->type + lVar11);
    uVar9 = puVar1[1];
    puVar3 = (undefined8 *)((long)&pSVar10->type + lVar11);
    *puVar3 = *puVar1;
    puVar3[1] = uVar9;
    puVar2 = (undefined4 *)((long)&pSVar10->begin + lVar11);
    *puVar2 = uVar5;
    puVar2[1] = uVar6;
    puVar2[2] = uVar7;
    puVar2[3] = uVar8;
    uVar13 = uVar13 + 1;
    lVar11 = lVar11 + 0x20;
  }
  if (pSVar4 != this->little) {
    if (this->allocator == (Allocator *)0x0) {
      if (pSVar4 != (SynBinaryOpElement *)0x0) {
        (*(code *)NULLC::dealloc)(pSVar4);
      }
    }
    else if (pSVar4 != (SynBinaryOpElement *)0x0) {
      (*this->allocator->_vptr_Allocator[3])();
    }
  }
  this->data = pSVar10;
  this->max = count;
  return;
}

Assistant:

void grow(unsigned newSize)
	{
		if(max + (max >> 1) > newSize)
			newSize = max + (max >> 1);
		else
			newSize += 4;

		T* newData = 0;
		
		if(allocator)
			newData = allocator->construct<T>(newSize);
		else
			newData = NULLC::construct<T>(newSize);

		for(unsigned i = 0; i < count; i++)
			newData[i] = data[i];

		if(data != little)
		{
			if(allocator)
				allocator->destruct(data, max);
			else
				NULLC::destruct(data, max);
		}

		data = newData;

		max = newSize;
	}